

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O0

QString * __thiscall QFileSystemComboBox::currentFileName(QFileSystemComboBox *this)

{
  QString *in_RDI;
  QString local_30;
  QFileSystemComboBox *in_stack_ffffffffffffffe8;
  
  currentFilePath(in_stack_ffffffffffffffe8);
  QFileInfo::QFileInfo((QFileInfo *)&stack0xffffffffffffffe8,&local_30);
  QFileInfo::fileName();
  QFileInfo::~QFileInfo((QFileInfo *)&stack0xffffffffffffffe8);
  QString::~QString((QString *)0x221f63);
  return in_RDI;
}

Assistant:

QString QFileSystemComboBox::currentFileName() const {
    return QFileInfo(currentFilePath()).fileName();
}